

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

void __thiscall project::gen_cmake(project *this)

{
  project *in_stack_000000f8;
  ofstream outfile;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [16];
  project *in_stack_fffffffffffffcd8;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [48];
  string local_228 [32];
  project *in_stack_fffffffffffffdf8;
  project *in_stack_fffffffffffffe18;
  project *in_stack_fffffffffffffe38;
  project *in_stack_fffffffffffffe48;
  project *in_stack_fffffffffffffe58;
  project *in_stack_fffffffffffffea8;
  project *in_stack_ffffffffffffff28;
  project *in_stack_ffffffffffffff48;
  project *in_stack_ffffffffffffffb8;
  
  get_cmake_file_abi_cxx11_(in_stack_fffffffffffffcd8);
  std::ofstream::ofstream(&stack0xfffffffffffffdf8,local_228,_S_bin);
  std::__cxx11::string::~string(local_228);
  get_header_abi_cxx11_(in_stack_fffffffffffffe38);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_258);
  std::__cxx11::string::~string(local_258);
  get_dependencies_abi_cxx11_(in_stack_ffffffffffffffb8);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_278);
  std::__cxx11::string::~string(local_278);
  get_cpp_standard_abi_cxx11_(in_stack_fffffffffffffe18);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_298);
  std::__cxx11::string::~string(local_298);
  get_defines_abi_cxx11_(in_stack_ffffffffffffff48);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_2b8);
  std::__cxx11::string::~string(local_2b8);
  get_include_dirs_abi_cxx11_(in_stack_fffffffffffffe58);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  get_autogen_vars_abi_cxx11_(in_stack_fffffffffffffdf8);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_2f8);
  std::__cxx11::string::~string(local_2f8);
  get_resource_files_abi_cxx11_(in_stack_ffffffffffffff28);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_318);
  std::__cxx11::string::~string(local_318);
  get_source_list_abi_cxx11_(in_stack_000000f8);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_338);
  std::__cxx11::string::~string(local_338);
  get_executable_abi_cxx11_(in_stack_fffffffffffffe48);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_358);
  std::__cxx11::string::~string(local_358);
  get_common_options_abi_cxx11_(in_stack_fffffffffffffe48);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_378);
  std::__cxx11::string::~string(local_378);
  get_target_config_abi_cxx11_(in_stack_fffffffffffffea8);
  std::operator<<((ostream *)&stack0xfffffffffffffdf8,local_398);
  std::__cxx11::string::~string(local_398);
  std::ofstream::close();
  std::ofstream::~ofstream(&stack0xfffffffffffffdf8);
  return;
}

Assistant:

void project::gen_cmake()
{
    std::ofstream outfile (get_cmake_file(), std::ofstream::binary);

    outfile << get_header();
    outfile << get_dependencies();
    outfile << get_cpp_standard();
    outfile << get_defines();
    outfile << get_include_dirs();
    outfile << get_autogen_vars();
    outfile << get_resource_files();
    outfile << get_source_list();
    //outfile << get_source_groups();
    outfile << get_executable();
    outfile << get_common_options();
    outfile << get_target_config();

    outfile.close();
}